

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O1

void __thiscall TldDSAsKey::Add(TldDSAsKey *this,TldDSAsKey *key)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  this->count = this->count + key->count;
  this->ds_count = this->ds_count + key->ds_count;
  if (key->algo_nb != 0) {
    uVar2 = 0;
    do {
      uVar1 = this->algo_nb;
      uVar3 = (ulong)uVar1;
      if (uVar3 != 0) {
        lVar4 = 0;
        do {
          if (this->algo_code[lVar4] == key->algo_code[uVar2]) {
            this->algo_count[lVar4] = this->algo_count[lVar4] + key->algo_count[uVar2];
            goto LAB_0016cc2f;
          }
          lVar4 = lVar4 + 1;
        } while (uVar1 != (uint)lVar4);
      }
      if (uVar1 < 8) {
        this->algo_code[uVar3] = key->algo_code[uVar2];
        this->algo_count[uVar3] = key->algo_count[uVar2];
        this->algo_nb = uVar1 + 1;
      }
LAB_0016cc2f:
      uVar2 = uVar2 + 1;
    } while (uVar2 < key->algo_nb);
  }
  return;
}

Assistant:

void TldDSAsKey::Add(TldDSAsKey * key)
{
    count += key->count;
    ds_count += key->ds_count;
    for (uint32_t i = 0; i < key->algo_nb; i++) {
        bool is_found = false;
        for (uint32_t j = 0; j < algo_nb; j++) {
            if (algo_code[j] == key->algo_code[i]) {
                algo_count[j] += key->algo_count[i];
                is_found = true;
                break;
            }
        }
        if (!is_found && algo_nb < 8) {
            algo_code[algo_nb] = key->algo_code[i];
            algo_count[algo_nb] = key->algo_count[i];
            algo_nb++;
        }
    }
}